

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O1

void __thiscall tf::TaskQueue<tf::Node_*>::push(TaskQueue<tf::Node_*> *this,Node *o)

{
  pointer *pppAVar1;
  ulong b;
  long t;
  iterator __position;
  Array *pAVar2;
  Array *a;
  __base_type local_28;
  
  b = (this->_bottom).super___atomic_base<long>._M_i;
  t = (this->_top).super___atomic_base<long>._M_i;
  local_28._M_p = (this->_array)._M_b._M_p;
  if ((local_28._M_p)->C <= (long)(b - t)) {
    pAVar2 = Array::resize(local_28._M_p,b,t);
    __position._M_current =
         (this->_garbage).
         super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_garbage).
        super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<tf::TaskQueue<tf::Node*>::Array*,std::allocator<tf::TaskQueue<tf::Node*>::Array*>>
      ::_M_realloc_insert<tf::TaskQueue<tf::Node*>::Array*const&>
                ((vector<tf::TaskQueue<tf::Node*>::Array*,std::allocator<tf::TaskQueue<tf::Node*>::Array*>>
                  *)&this->_garbage,__position,&local_28._M_p);
    }
    else {
      *__position._M_current = local_28._M_p;
      pppAVar1 = &(this->_garbage).
                  super__Vector_base<tf::TaskQueue<tf::Node_*>::Array_*,_std::allocator<tf::TaskQueue<tf::Node_*>::Array_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppAVar1 = *pppAVar1 + 1;
    }
    (this->_array)._M_b._M_p = pAVar2;
    local_28._M_p = pAVar2;
  }
  (local_28._M_p)->S[(local_28._M_p)->M & b]._M_b._M_p = o;
  (this->_bottom).super___atomic_base<long>._M_i = b + 1;
  return;
}

Assistant:

void TaskQueue<T>::push(T o) {
  //if(auto tmp = _cache.load(std::memory_order_relaxed); tmp) {
  //  uncached_push(tmp);
  //}
  //_cache.store(o, std::memory_order_relaxed);

  int64_t b = _bottom.load(std::memory_order_relaxed);
  int64_t t = _top.load(std::memory_order_acquire);
  Array* a = _array.load(std::memory_order_relaxed);

  // queue is full
  if(a->capacity() - 1 < (b - t)) {
    Array* tmp = a->resize(b, t);
    _garbage.push_back(a);
    std::swap(a, tmp);
    _array.store(a, std::memory_order_release);
    // Note: the original paper using relaxed causes t-san to complain
    //_array.store(a, std::memory_order_relaxed);
  }

  a->push(b, o);
  std::atomic_thread_fence(std::memory_order_release);
  _bottom.store(b + 1, std::memory_order_relaxed);
}